

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_metadata.hpp
# Opt level: O0

void boost::python::objects::
     register_shared_ptr_from_python_and_casts<SpikesConsumer,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
               (SpikesConsumer *param_1)

{
  shared_ptr_from_python<SpikesConsumer,_std::shared_ptr> local_12;
  shared_ptr_from_python<SpikesConsumer,_boost::shared_ptr> local_11;
  
  converter::shared_ptr_from_python<SpikesConsumer,_boost::shared_ptr>::shared_ptr_from_python
            ((shared_ptr_from_python<SpikesConsumer,_boost::shared_ptr> *)param_1);
  python::detail::
  force_instantiate<boost::python::converter::shared_ptr_from_python<SpikesConsumer,boost::shared_ptr>>
            (&local_11);
  converter::shared_ptr_from_python<SpikesConsumer,_std::shared_ptr>::shared_ptr_from_python
            ((shared_ptr_from_python<SpikesConsumer,_std::shared_ptr> *)param_1);
  python::detail::
  force_instantiate<boost::python::converter::shared_ptr_from_python<SpikesConsumer,std::shared_ptr>>
            (&local_12);
  register_dynamic_id<SpikesConsumer>(param_1);
  mpl::
  for_each<boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,std::add_pointer<mpl_::arg<_1>>,boost::python::objects::register_base_of<SpikesConsumer>>
            (0);
  return;
}

Assistant:

inline void register_shared_ptr_from_python_and_casts(T*, Bases)
{
  // Constructor performs registration
  python::detail::force_instantiate(converter::shared_ptr_from_python<T, boost::shared_ptr>());
#if __cplusplus >= 201103L
  python::detail::force_instantiate(converter::shared_ptr_from_python<T, std::shared_ptr>());
#endif

  //
  // register all up/downcasts here.  We're using the alternate
  // interface to mpl::for_each to avoid an MSVC 6 bug.
  //
  register_dynamic_id<T>();
  mpl::for_each(register_base_of<T>(), (Bases*)0, (boost::python::detail::add_pointer<mpl::_>*)0);
}